

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  byte bVar1;
  stbi__uint32 sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long *in_FS_OFFSET;
  
  if (j->spec_end != 0) goto LAB_001c1260;
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->succ_high != 0) {
    iVar8 = j->code_bits;
    if (iVar8 < 1) {
      stbi__grow_buffer_unsafe(j);
      iVar8 = j->code_bits;
    }
    sVar2 = j->code_buffer;
    j->code_buffer = sVar2 * 2;
    j->code_bits = iVar8 + -1;
    if (-1 < (int)sVar2) {
      return 1;
    }
    *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
    return 1;
  }
  data[0x38] = 0;
  data[0x39] = 0;
  data[0x3a] = 0;
  data[0x3b] = 0;
  data[0x3c] = 0;
  data[0x3d] = 0;
  data[0x3e] = 0;
  data[0x3f] = 0;
  data[0x30] = 0;
  data[0x31] = 0;
  data[0x32] = 0;
  data[0x33] = 0;
  data[0x34] = 0;
  data[0x35] = 0;
  data[0x36] = 0;
  data[0x37] = 0;
  data[0x28] = 0;
  data[0x29] = 0;
  data[0x2a] = 0;
  data[0x2b] = 0;
  data[0x2c] = 0;
  data[0x2d] = 0;
  data[0x2e] = 0;
  data[0x2f] = 0;
  data[0x20] = 0;
  data[0x21] = 0;
  data[0x22] = 0;
  data[0x23] = 0;
  data[0x24] = 0;
  data[0x25] = 0;
  data[0x26] = 0;
  data[0x27] = 0;
  data[0x18] = 0;
  data[0x19] = 0;
  data[0x1a] = 0;
  data[0x1b] = 0;
  data[0x1c] = 0;
  data[0x1d] = 0;
  data[0x1e] = 0;
  data[0x1f] = 0;
  data[0x10] = 0;
  data[0x11] = 0;
  data[0x12] = 0;
  data[0x13] = 0;
  data[0x14] = 0;
  data[0x15] = 0;
  data[0x16] = 0;
  data[0x17] = 0;
  data[8] = 0;
  data[9] = 0;
  data[10] = 0;
  data[0xb] = 0;
  data[0xc] = 0;
  data[0xd] = 0;
  data[0xe] = 0;
  data[0xf] = 0;
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar3 = j->code_buffer;
  uVar6 = (ulong)hdc->fast[uVar3 >> 0x17];
  if (uVar6 == 0xff) {
    lVar10 = 0;
    do {
      lVar9 = lVar10;
      lVar10 = lVar9 + 1;
    } while (hdc->maxcode[lVar9 + 10] <= uVar3 >> 0x10);
    iVar8 = j->code_bits;
    if (lVar10 == 8) {
      j->code_bits = iVar8 + -0x10;
      goto LAB_001c1260;
    }
    if (iVar8 < (int)(lVar9 + 10)) goto LAB_001c1260;
    uVar5 = stbi__bmask[lVar9 + 10];
    iVar4 = hdc->delta[lVar9 + 10];
    iVar8 = (iVar8 - (int)lVar10) + -9;
    uVar7 = uVar3 << ((byte)(lVar9 + 10) & 0x1f);
    j->code_bits = iVar8;
    j->code_buffer = uVar7;
    uVar6 = (ulong)(int)((uVar3 >> (0x17U - (char)lVar10 & 0x1f) & uVar5) + iVar4);
  }
  else {
    bVar1 = hdc->size[uVar6];
    iVar8 = j->code_bits - (uint)bVar1;
    if (j->code_bits < (int)(uint)bVar1) goto LAB_001c1260;
    uVar7 = uVar3 << (bVar1 & 0x1f);
    j->code_buffer = uVar7;
    j->code_bits = iVar8;
  }
  bVar1 = hdc->values[uVar6];
  if (bVar1 < 0x10) {
    if (bVar1 == 0) {
      iVar8 = 0;
    }
    else {
      if (iVar8 < (int)(uint)bVar1) {
        stbi__grow_buffer_unsafe(j);
        uVar7 = j->code_buffer;
        iVar8 = j->code_bits;
      }
      uVar5 = uVar7 << (bVar1 & 0x1f) | uVar7 >> 0x20 - (bVar1 & 0x1f);
      uVar3 = *(uint *)((long)stbi__bmask + (ulong)((uint)bVar1 * 4));
      j->code_buffer = ~uVar3 & uVar5;
      j->code_bits = iVar8 - (uint)bVar1;
      iVar8 = 0;
      if (-1 < (int)uVar7) {
        iVar8 = *(int *)((long)stbi__jbias + (ulong)((uint)bVar1 * 4));
      }
      iVar8 = iVar8 + (uVar3 & uVar5);
    }
    iVar8 = iVar8 + j->img_comp[b].dc_pred;
    j->img_comp[b].dc_pred = iVar8;
    *data = (short)(iVar8 << ((byte)j->succ_low & 0x1f));
    return 1;
  }
LAB_001c1260:
  *(char **)(*in_FS_OFFSET + -0x20) = "can\'t merge dc and ac";
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t < 0 || t > 15) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      data[0] = (short) (dc * (1 << j->succ_low));
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}